

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong size;
  char *__format;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  ulong size_00;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int local_100;
  int local_fc;
  int local_c8;
  int local_b8;
  int local_b4;
  int NWL;
  int NWS;
  int NWM;
  int local_a0;
  int local_9c;
  ulong uVar18;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "_s2";
LAB_004f188d:
    fprintf(_stderr,__format,"parasail_sg_flags_stats",pcVar19);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar19 = "s2Len";
    goto LAB_004f188d;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar19 = "open";
    goto LAB_004f188d;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar19 = "gap";
    goto LAB_004f188d;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "matrix";
    goto LAB_004f188d;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sg_flags_stats");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "_s1";
      goto LAB_004f188d;
    }
    uVar13 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar19 = "_s1Len";
      goto LAB_004f188d;
    }
    if (matrix->type == 0) goto LAB_004f0efa;
  }
  uVar13 = (ulong)(uint)matrix->length;
LAB_004f0efa:
  ppVar10 = parasail_result_new_stats();
  if (ppVar10 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar10->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x1410102;
  iVar8 = (int)uVar13;
  ptr = parasail_memalign_int(0x10,(long)iVar8);
  size = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size);
  size_00 = (ulong)(s2Len + 1);
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,size_00);
  ptr_03 = parasail_memalign_int(0x10,size_00);
  ptr_04 = parasail_memalign_int(0x10,size_00);
  ptr_05 = parasail_memalign_int(0x10,size_00);
  ptr_06 = parasail_memalign_int(0x10,size_00);
  ptr_07 = parasail_memalign_int(0x10,size_00);
  ptr_08 = parasail_memalign_int(0x10,size_00);
  local_c8 = (int)ptr_00;
  auVar33._0_4_ = -(uint)((int)ptr == 0);
  auVar33._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar33._8_4_ = -(uint)(local_c8 == 0);
  auVar33._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar38._4_4_ = auVar33._0_4_;
  auVar38._0_4_ = auVar33._4_4_;
  auVar38._8_4_ = auVar33._12_4_;
  auVar38._12_4_ = auVar33._8_4_;
  auVar34._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar34._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar34._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar34._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar39._4_4_ = auVar34._0_4_;
  auVar39._0_4_ = auVar34._4_4_;
  auVar39._8_4_ = auVar34._12_4_;
  auVar39._12_4_ = auVar34._8_4_;
  auVar39 = packssdw(auVar38 & auVar33,auVar39 & auVar34);
  auVar36._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar36._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar36._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar36._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar32._4_4_ = auVar36._0_4_;
  auVar32._0_4_ = auVar36._4_4_;
  auVar32._8_4_ = auVar36._12_4_;
  auVar32._12_4_ = auVar36._8_4_;
  auVar37._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar37._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar37._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar37._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar35._4_4_ = auVar37._0_4_;
  auVar35._0_4_ = auVar37._4_4_;
  auVar35._8_4_ = auVar37._12_4_;
  auVar35._12_4_ = auVar37._8_4_;
  auVar33 = packssdw(auVar32 & auVar36,auVar35 & auVar37);
  auVar33 = packssdw(auVar39,auVar33);
  uVar11 = 0;
  if ((ptr_08 == (int *)0x0 || ptr_07 == (int *)0x0) ||
      ((((((((auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'))
  {
    return (parasail_result_t *)0x0;
  }
  iVar14 = iVar8 + -1;
  uVar15 = s2Len - 1;
  uVar18 = (ulong)uVar15;
  if (iVar8 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    ptr[uVar11] = matrix->mapper[(byte)_s1[uVar11]];
  }
  piVar5 = matrix->mapper;
  for (uVar11 = 0; size != uVar11; uVar11 = uVar11 + 1) {
    ptr_00[uVar11] = piVar5[(byte)_s2[uVar11]];
  }
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_05 = -0x40000000;
  *ptr_06 = 0;
  *ptr_07 = 0;
  *ptr_08 = 0;
  if (s2_beg == 0) {
    iVar8 = -open;
    for (uVar11 = 1; size_00 != uVar11; uVar11 = uVar11 + 1) {
      ptr_01[uVar11] = iVar8;
      ptr_02[uVar11] = 0;
      ptr_03[uVar11] = 0;
      ptr_04[uVar11] = 0;
      ptr_05[uVar11] = -0x40000000;
      ptr_06[uVar11] = 0;
      ptr_07[uVar11] = 0;
      ptr_08[uVar11] = 0;
      iVar8 = iVar8 - gap;
    }
  }
  else {
    for (uVar11 = 1; size_00 != uVar11; uVar11 = uVar11 + 1) {
      ptr_01[uVar11] = 0;
      ptr_02[uVar11] = 0;
      ptr_03[uVar11] = 0;
      ptr_04[uVar11] = 0;
      ptr_05[uVar11] = -0x40000000;
      ptr_06[uVar11] = 0;
      ptr_07[uVar11] = 0;
      ptr_08[uVar11] = 0;
    }
  }
  iVar8 = -0x40000000;
  local_b4 = -0x40000000;
  local_b8 = -0x40000000;
  local_fc = -0x40000000;
  local_100 = iVar14;
  for (uVar11 = 1; uVar11 != (int)uVar13 + 1; uVar11 = uVar11 + 1) {
    if (matrix->type == 0) {
      lVar12 = (long)ptr[uVar11 - 1];
    }
    else {
      lVar12 = uVar11 - 1;
    }
    lVar12 = lVar12 * matrix->size;
    piVar5 = matrix->matrix;
    uVar20 = 0;
    iVar28 = *ptr_01;
    NWM = *ptr_02;
    NWS = *ptr_03;
    NWL = *ptr_04;
    uVar23 = (ulong)(uint)((1 - (int)uVar11) * gap - open);
    if (s1_beg != 0) {
      uVar23 = uVar20;
    }
    *ptr_01 = (int)uVar23;
    *ptr_02 = 0;
    *ptr_03 = 0;
    *ptr_04 = 0;
    uVar21 = 0xc0000000;
    iVar16 = 0;
    iVar25 = 0;
    iVar30 = 0;
    local_a0 = 0;
    local_9c = 0;
    iVar26 = 0;
    for (; iVar9 = (int)uVar23, size_00 - 1 != uVar20; uVar20 = uVar20 + 1) {
      iVar1 = ptr_01[uVar20 + 1];
      iVar2 = ptr_02[uVar20 + 1];
      iVar3 = ptr_03[uVar20 + 1];
      uVar27 = iVar1 - open;
      uVar31 = ptr_05[uVar20 + 1] - gap;
      uVar6 = uVar31;
      if ((int)uVar31 < (int)uVar27) {
        uVar6 = uVar27;
      }
      iVar4 = ptr_04[uVar20 + 1];
      ptr_05[uVar20 + 1] = uVar6;
      uVar17 = iVar9 - open;
      uVar22 = uVar21 - gap;
      uVar21 = uVar17;
      if ((int)uVar17 <= (int)uVar22) {
        uVar21 = uVar22;
      }
      uVar29 = iVar28 + piVar5[lVar12 + ptr_00[uVar20]];
      uVar7 = uVar21;
      if ((int)uVar21 < (int)uVar29) {
        uVar7 = uVar29;
      }
      if ((int)uVar7 <= (int)uVar6) {
        uVar7 = uVar6;
      }
      uVar23 = (ulong)uVar7;
      if ((int)uVar31 < (int)uVar27) {
        ptr_06[uVar20 + 1] = iVar2;
        ptr_07[uVar20 + 1] = iVar3;
        iVar28 = iVar4;
      }
      else {
        iVar28 = ptr_08[uVar20 + 1];
      }
      ptr_08[uVar20 + 1] = iVar28 + 1;
      iVar9 = iVar16;
      iVar24 = iVar25;
      if ((int)uVar17 <= (int)uVar22) {
        iVar9 = local_a0;
        iVar24 = local_9c;
        iVar30 = iVar26;
      }
      iVar26 = iVar30 + 1;
      if (uVar7 == uVar29) {
        iVar16 = NWM + (uint)(ptr[uVar11 - 1] == ptr_00[uVar20]);
        iVar25 = NWS + (uint)(0 < piVar5[lVar12 + ptr_00[uVar20]]);
        iVar30 = NWL + 1;
      }
      else {
        iVar16 = iVar9;
        iVar25 = iVar24;
        iVar30 = iVar26;
        if (uVar7 == ptr_05[uVar20 + 1]) {
          iVar16 = ptr_06[uVar20 + 1];
          iVar25 = ptr_07[uVar20 + 1];
          iVar30 = iVar28 + 1;
        }
      }
      ptr_01[uVar20 + 1] = uVar7;
      ptr_02[uVar20 + 1] = iVar16;
      ptr_03[uVar20 + 1] = iVar25;
      ptr_04[uVar20 + 1] = iVar30;
      iVar28 = iVar1;
      NWL = iVar4;
      NWS = iVar3;
      NWM = iVar2;
      local_a0 = iVar9;
      local_9c = iVar24;
    }
    if ((s1_end != 0) && (iVar8 < iVar9)) {
      local_100 = (int)uVar11 + -1;
      iVar8 = iVar9;
      local_fc = iVar30;
      local_b8 = iVar25;
      local_b4 = iVar16;
    }
  }
  if (s1_end == 0 || s2_end == 0) {
    uVar21 = uVar15;
    if (s2_end != 0) {
      for (uVar13 = 0; uVar21 = (uint)uVar18, size_00 - 1 != uVar13; uVar13 = uVar13 + 1) {
        if (iVar8 < ptr_01[uVar13 + 1]) {
          local_b4 = ptr_02[uVar13 + 1];
          local_b8 = ptr_03[uVar13 + 1];
          local_fc = ptr_04[uVar13 + 1];
          uVar18 = uVar13 & 0xffffffff;
          iVar8 = ptr_01[uVar13 + 1];
          local_100 = iVar14;
        }
      }
    }
  }
  else {
    for (uVar13 = 1; uVar21 = (uint)uVar18, size_00 != uVar13; uVar13 = uVar13 + 1) {
      iVar28 = ptr_01[uVar13];
      if (iVar8 < iVar28) {
        local_b4 = ptr_02[uVar13];
        local_b8 = ptr_03[uVar13];
        local_fc = ptr_04[uVar13];
        iVar8 = iVar28;
LAB_004f1678:
        uVar18 = (ulong)((int)uVar13 - 1);
        local_100 = iVar14;
      }
      else if ((iVar28 == iVar8) && ((long)uVar13 <= (long)(int)(uint)uVar18)) {
        local_b4 = ptr_02[uVar13];
        local_b8 = ptr_03[uVar13];
        local_fc = ptr_04[uVar13];
        goto LAB_004f1678;
      }
    }
  }
  if (s2_end == 0 && s1_end == 0) {
    iVar8 = ptr_01[size];
    local_b4 = ptr_02[size];
    local_b8 = ptr_03[size];
    local_fc = ptr_04[size];
    local_100 = iVar14;
    uVar21 = uVar15;
  }
  ppVar10->score = iVar8;
  ppVar10->end_query = local_100;
  ppVar10->end_ref = uVar21;
  ((ppVar10->field_4).stats)->matches = local_b4;
  ((ppVar10->field_4).stats)->similar = local_b8;
  ((ppVar10->field_4).stats)->length = local_fc;
  parasail_free(ptr_08);
  parasail_free(ptr_07);
  parasail_free(ptr_06);
  parasail_free(ptr_05);
  parasail_free(ptr_04);
  parasail_free(ptr_03);
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar10;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len-1;
    end_ref = s2Len-1;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }


    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
        if (s1_end && WH > score) {
            score = WH;
            matches = WHM;
            similar = WHS;
            length = WHL;
            end_query = i-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
    if (s1_end && s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == H[j] && j-1 < end_ref) {
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    else if (s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s2Len];
        matches = HM[s2Len];
        similar = HS[s2Len];
        length = HL[s2Len];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}